

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::die(Player *this)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  ResourceManager *this_00;
  void *pvVar4;
  void *pvVar5;
  undefined8 uVar6;
  undefined8 in_XMM1_Qa;
  
  shake();
  reset(this);
  iVar1 = this->lives;
  this->lives = iVar1 + -1;
  if (iVar1 < 2) {
    (this->super_Entity).isDestructable = false;
    this->invincibleCount = 8000;
    uVar3 = al_get_target_bitmap();
    al_set_target_bitmap(this->highscoreBitmap);
    iVar1 = al_get_bitmap_width(this->highscoreBitmap);
    iVar2 = al_get_bitmap_height(this->highscoreBitmap);
    this_00 = ResourceManager::getInstance();
    pvVar4 = ResourceManager::getData(this_00,3);
    pvVar5 = ResourceManager::getData(this_00,4);
    al_map_rgb(0xff,0xff,0xff);
    al_draw_textf(pvVar4,1,"GAME OVER");
    uVar6 = al_map_rgb(0xff,0xff,0xff);
    al_draw_textf(uVar6,in_XMM1_Qa,(float)(iVar1 / 2),(float)(iVar2 / 2 + 0x10),pvVar5,1,"%d Points"
                  ,this->score);
    al_set_target_bitmap(uVar3);
    return;
  }
  (this->super_Entity).hp = 1;
  (this->super_Entity).isDestructable = false;
  this->invincibleCount = 3000;
  return;
}

Assistant:

void Player::die(void)
{
   shake();
   reset();

   lives--;
   if (lives <= 0) {
      // game over
      isDestructable = false;
      invincibleCount = 8000;
      ALLEGRO_BITMAP *old_target = al_get_target_bitmap();
      al_set_target_bitmap(highscoreBitmap);
      int w = al_get_bitmap_width(highscoreBitmap);
      int h = al_get_bitmap_height(highscoreBitmap);
      ResourceManager& rm = ResourceManager::getInstance();
      ALLEGRO_FONT *large_font = (ALLEGRO_FONT *)rm.getData(RES_LARGEFONT);
      ALLEGRO_FONT *small_font = (ALLEGRO_FONT *)rm.getData(RES_SMALLFONT);
      al_draw_textf(large_font, al_map_rgb(255, 255, 255), w/2, h/2-16, ALLEGRO_ALIGN_CENTRE, "GAME OVER");
      al_draw_textf(small_font, al_map_rgb(255, 255, 255), w/2, h/2+16, ALLEGRO_ALIGN_CENTRE, "%d Points", score);
      al_set_target_bitmap(old_target);
   }
   else {
      hp = 1;
      isDestructable = false;
      invincibleCount = 3000;
   }
}